

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O3

void __thiscall xray_re::xr_bone_motion::xr_bone_motion(xr_bone_motion *this)

{
  this->_vptr_xr_bone_motion = (_func_int **)&PTR__xr_bone_motion_0024b338;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  this->m_envelopes[0] = (xr_envelope *)0x0;
  this->m_envelopes[1] = (xr_envelope *)0x0;
  this->m_envelopes[2] = (xr_envelope *)0x0;
  this->m_envelopes[3] = (xr_envelope *)0x0;
  this->m_envelopes[4] = (xr_envelope *)0x0;
  this->m_envelopes[5] = (xr_envelope *)0x0;
  this->m_flags = '\0';
  return;
}

Assistant:

xr_bone_motion::xr_bone_motion(): m_flags(0)
{
	std::uninitialized_fill_n(m_envelopes, xr_dim(m_envelopes), static_cast<xr_envelope*>(0));
}